

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_locate_between(REF_INTERP ref_interp,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_NODE pRVar1;
  REF_INT *pRVar2;
  REF_AGENTS ref_agents;
  REF_INT *pRVar3;
  REF_AGENT_STRUCT *pRVar4;
  REF_DBL *pRVar5;
  REF_INTERP ref_interp_00;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  REF_MPI pRVar10;
  char *pcVar11;
  undefined8 uVar12;
  REF_INT id;
  REF_LIST ref_list;
  REF_INT local_4c;
  REF_NODE local_48;
  REF_LIST local_40;
  REF_MPI local_38;
  
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7a4,
           "ref_interp_locate_between","ref_interp NULL");
    return 2;
  }
  pRVar10 = ref_interp->ref_mpi;
  pRVar1 = ref_interp->to_grid->node;
  if ((ref_interp->max <= new_node) &&
     (uVar6 = ref_interp_resize(ref_interp,pRVar1->max), uVar6 != 0)) {
    pcVar11 = "resize";
    uVar8 = 0x7aa;
    goto LAB_0014d959;
  }
  pRVar2 = ref_interp->cell;
  pRVar2[new_node] = -1;
  ref_agents = ref_interp->ref_agents;
  uVar7 = (ulong)ref_agents->n;
  local_48 = pRVar1;
  if (uVar7 != 0) {
    pcVar11 = "did not expect active agents";
    uVar8 = 0x7af;
    uVar12 = 0;
LAB_0014d9b4:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar8,
           "ref_interp_locate_between",pcVar11,uVar12,uVar7);
    return 1;
  }
  local_4c = -1;
  if (((node0 != -1) && (pRVar2[node0] != -1)) &&
     (pRVar3 = ref_interp->part, pRVar10->id == pRVar3[node0])) {
    ref_interp->agent_hired[new_node] = 1;
    local_38 = pRVar10;
    uVar6 = ref_agents_push(ref_agents,new_node,pRVar3[node0],pRVar2[node0],
                            pRVar1->real + new_node * 0xf,&local_4c);
    if (uVar6 != 0) {
      pcVar11 = "requeue";
      uVar8 = 0x7ba;
      goto LAB_0014d959;
    }
    uVar7 = (ulong)ref_agents->agent[local_4c].mode;
    if (uVar7 != 1) {
      pcVar11 = "not walking?";
      uVar12 = 1;
      uVar8 = 0x7bb;
      goto LAB_0014d9b4;
    }
    uVar6 = ref_interp_walk_agent(ref_interp,local_4c);
    if (uVar6 != 0) {
      pcVar11 = "walking";
      uVar8 = 0x7bc;
      goto LAB_0014d959;
    }
    pRVar10 = local_38;
    if (ref_agents->agent[local_4c].mode != REF_AGENT_ENCLOSING) {
      ref_interp->agent_hired[new_node] = 0;
      uVar6 = ref_agents_remove(ref_agents,local_4c);
      if (uVar6 != 0) {
        pcVar11 = "no longer needed";
        uVar8 = 0x7bf;
        goto LAB_0014d959;
      }
      local_4c = -1;
      pRVar10 = local_38;
    }
  }
  if (node1 == -1 || local_4c != -1) {
LAB_0014dcd0:
    if (local_4c != -1) {
      pRVar4 = ref_agents->agent;
      if (pRVar4[local_4c].mode == REF_AGENT_ENCLOSING) {
        ref_interp->cell[new_node] = pRVar4[local_4c].seed;
        ref_interp->part[new_node] = pRVar4[local_4c].part;
        pRVar5 = ref_interp->bary;
        lVar9 = 0;
        do {
          pRVar5[new_node * 4 + lVar9] = pRVar4[local_4c].bary[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        ref_interp->walk_steps = pRVar4[local_4c].step + ref_interp->walk_steps + 1;
        ref_interp->n_walk = ref_interp->n_walk + 1;
      }
      else {
        ref_interp->cell[new_node] = -1;
      }
      ref_interp->agent_hired[new_node] = 0;
      uVar6 = ref_agents_remove(ref_agents,local_4c);
      if (uVar6 != 0) {
        pcVar11 = "no longer needed";
        uVar8 = 0x7e3;
LAB_0014d959:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar8,"ref_interp_locate_between",(ulong)uVar6,pcVar11);
        return uVar6;
      }
    }
  }
  else {
    pRVar2 = ref_interp->cell;
    if ((pRVar2[node1] != -1) && (pRVar3 = ref_interp->part, pRVar10->id == pRVar3[node1])) {
      ref_interp->agent_hired[new_node] = 1;
      uVar6 = ref_agents_push(ref_agents,new_node,pRVar3[node1],pRVar2[node1],
                              local_48->real + new_node * 0xf,&local_4c);
      if (uVar6 != 0) {
        pcVar11 = "requeue";
        uVar8 = 0x7cb;
        goto LAB_0014d959;
      }
      uVar7 = (ulong)ref_agents->agent[local_4c].mode;
      if (uVar7 != 1) {
        pcVar11 = "not walking?";
        uVar12 = 1;
        uVar8 = 0x7cc;
        goto LAB_0014d9b4;
      }
      uVar6 = ref_interp_walk_agent(ref_interp,local_4c);
      if (uVar6 != 0) {
        pcVar11 = "walking";
        uVar8 = 0x7cd;
        goto LAB_0014d959;
      }
      if (ref_agents->agent[local_4c].mode == REF_AGENT_ENCLOSING) goto LAB_0014dcd0;
      ref_interp->agent_hired[new_node] = 0;
      uVar6 = ref_agents_remove(ref_agents,local_4c);
      if (uVar6 != 0) {
        pcVar11 = "no longer needed";
        uVar8 = 2000;
        goto LAB_0014d959;
      }
      local_4c = -1;
    }
  }
  if (1 < pRVar10->n) {
    return 0;
  }
  if (ref_interp->cell[new_node] != -1) {
    return 0;
  }
  uVar6 = ref_list_create(&local_40);
  if (uVar6 != 0) {
    pcVar11 = "create list";
    uVar8 = 0x7e9;
LAB_0014deb9:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar8,
           "ref_interp_locate_between",(ulong)uVar6,pcVar11);
    return uVar6;
  }
  uVar6 = ref_search_touching(ref_interp->ref_search,local_40,local_48->real + new_node * 0xf,
                              ref_interp->search_fuzz);
  if (uVar6 != 0) {
    pcVar11 = "tch";
    uVar8 = 0x7ed;
    goto LAB_0014deb9;
  }
  if (0 < local_40->n) {
    ref_interp_00 = (REF_INTERP)ref_interp->from_grid->node;
    if (ref_interp->from_grid->twod == 0) {
      uVar6 = ref_interp_enclosing_tet_in_list
                        (ref_interp_00,(REF_LIST)ref_interp->from_tet,(REF_DBL *)local_40,
                         (REF_INT *)(local_48->real + new_node * 0xf),
                         (REF_DBL *)(ref_interp->cell + new_node));
      if (uVar6 != 0) {
        pcVar11 = "best in list";
        uVar8 = 0x7fa;
        goto LAB_0014dfac;
      }
    }
    else {
      uVar6 = ref_interp_enclosing_tri_in_list
                        (ref_interp_00,(REF_LIST)ref_interp->from_tri,(REF_DBL *)local_40,
                         (REF_INT *)(local_48->real + new_node * 0xf),
                         (REF_DBL *)(ref_interp->cell + new_node));
      if (uVar6 != 0) {
        pcVar11 = "best in list";
        uVar8 = 0x7f4;
        goto LAB_0014dfac;
      }
    }
  }
  uVar6 = ref_list_free(local_40);
  if (uVar6 == 0) {
    return 0;
  }
  pcVar11 = "free list";
  uVar8 = 0x7fd;
LAB_0014dfac:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar8,
         "ref_interp_locate_between",(ulong)uVar6,pcVar11);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_between(REF_INTERP ref_interp,
                                             REF_INT node0, REF_INT node1,
                                             REF_INT new_node) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");

  ref_mpi = ref_interp_mpi(ref_interp);
  ref_grid = ref_interp_to_grid(ref_interp);
  ref_node = ref_grid_node(ref_grid);
  if (new_node >= ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(ref_node)), "resize");
  }
  ref_interp->cell[new_node] = REF_EMPTY; /* initialize new_node locate */

  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  id = REF_EMPTY;

  if (id == REF_EMPTY && node0 != REF_EMPTY &&
      REF_EMPTY != ref_interp->cell[node0] &&
      ref_mpi_rank(ref_mpi) == ref_interp->part[node0]) {
    ref_interp->agent_hired[new_node] = REF_TRUE;
    RSS(ref_agents_push(ref_agents, new_node, ref_interp->part[node0],
                        ref_interp->cell[node0],
                        ref_node_xyz_ptr(ref_node, new_node), &id),
        "requeue");
    REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "not walking?");
    RSS(ref_interp_walk_agent(ref_interp, id), "walking");
    if (REF_AGENT_ENCLOSING != ref_agent_mode(ref_agents, id)) {
      ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
      RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      id = REF_EMPTY;
    }
  }

  if (id == REF_EMPTY && node1 != REF_EMPTY &&
      REF_EMPTY != ref_interp->cell[node1] &&
      ref_mpi_rank(ref_mpi) == ref_interp->part[node1]) {
    ref_interp->agent_hired[new_node] = REF_TRUE;
    RSS(ref_agents_push(ref_agents, new_node, ref_interp->part[node1],
                        ref_interp->cell[node1],
                        ref_node_xyz_ptr(ref_node, new_node), &id),
        "requeue");
    REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "not walking?");
    RSS(ref_interp_walk_agent(ref_interp, id), "walking");
    if (REF_AGENT_ENCLOSING != ref_agent_mode(ref_agents, id)) {
      ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
      RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      id = REF_EMPTY;
    }
  }

  if (id != REF_EMPTY) {
    if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
      ref_interp->cell[new_node] = ref_agent_seed(ref_agents, id);
      ref_interp->part[new_node] = ref_agent_part(ref_agents, id);
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * new_node] = ref_agent_bary(ref_agents, i, id);
      (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
      (ref_interp->n_walk)++;
    } else {
      /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
      /* what for parallel REF_AGENT_HOP_PART */
      ref_interp->cell[new_node] = REF_EMPTY;
    }
    ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
    RSS(ref_agents_remove(ref_agents, id), "no longer needed");
  }

  if (!ref_mpi_para(ref_mpi) && REF_EMPTY == ref_interp->cell[new_node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, new_node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, new_node),
                &(ref_interp->cell[new_node]),
                &(ref_interp->bary[4 * new_node])),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, new_node),
                &(ref_interp->cell[new_node]),
                &(ref_interp->bary[4 * new_node])),
            "best in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}